

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::erase
          (QMovableArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,qsizetype n)

{
  qsizetype *pqVar1;
  QItemSelectionRange *pQVar2;
  QItemSelectionRange *__last;
  
  __last = b + n;
  std::_Destroy_aux<false>::__destroy<QItemSelectionRange*>(b,__last);
  pQVar2 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.ptr;
  if ((pQVar2 == b) &&
     (__last != pQVar2 + (this->super_QGenericArrayOps<QItemSelectionRange>).
                         super_QArrayDataPointer<QItemSelectionRange>.size)) {
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .ptr = __last;
  }
  else if (__last != pQVar2 + (this->super_QGenericArrayOps<QItemSelectionRange>).
                              super_QArrayDataPointer<QItemSelectionRange>.size) {
    memmove(b,__last,(long)(pQVar2 + (this->super_QGenericArrayOps<QItemSelectionRange>).
                                     super_QArrayDataPointer<QItemSelectionRange>.size) -
                     (long)__last);
  }
  pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
            super_QArrayDataPointer<QItemSelectionRange>.size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }